

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

bool __thiscall
afsm::
state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
skip_deferred_queue(state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                    *this)

{
  bool bVar1;
  event_set st;
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  _Stack_38;
  
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>,std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>,std::insert_iterator<std::set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->handled_)._M_t._M_impl.super__Rb_tree_header,
             (this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header,&_Stack_38);
  bVar1 = _Stack_38._M_impl.super__Rb_tree_header._M_node_count == 0;
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&_Stack_38);
  return bVar1;
}

Assistant:

void
    process_deferred_queue()
    {
        using actions::event_process_result;
        event_queue deferred;
        {
            lock_guard lock{deferred_mutex_};
            ::std::swap(deferred_events_, deferred);
        }
        while (!deferred.empty()) {
            observer_wrapper::start_process_deferred_queue(*this, deferred.size());
            auto res = event_process_result::refuse;
            while (!deferred.empty()) {
                res = deferred.top().first();
                deferred.pop();
                if (res == event_process_result::process)
                    break;
            }
            {
                lock_guard lock{deferred_mutex_};
                while (!deferred.empty()) {
                    deferred_events_.push(deferred.top());
                    deferred.pop();
                }
            }
            observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
            if (res == event_process_result::process) {
                ::std::swap(deferred_events_, deferred);
            }
        }
    }